

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonBondedInteractionsSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::NonBondedInteractionsSectionParser::parseLine
          (NonBondedInteractionsSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  double dVar1;
  int iVar2;
  EAMInteractionType *pEVar3;
  uint in_ECX;
  long in_RDI;
  RealType RVar4;
  pair<int,_double> pVar5;
  int i;
  RealType coefficient;
  int power;
  int nPairs;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> series;
  RealType Cj;
  RealType Ci;
  RealType A_2;
  RealType alpha_1;
  RealType re_1;
  RealType lambda;
  RealType kappa;
  RealType B_1;
  RealType A_1;
  RealType beta_1;
  RealType alpha;
  RealType re;
  RealType epsilon_3;
  RealType sigma_3;
  RealType C;
  RealType B;
  RealType A;
  string btype;
  int mAtt;
  int nRep_1;
  RealType epsilon_2;
  RealType sigma_2;
  int nRep;
  RealType epsilon_1;
  RealType sigma_1;
  RealType epsilon;
  RealType sigma;
  RealType beta0_1;
  RealType D0_1;
  RealType r0_1;
  RealType beta0;
  RealType D0;
  RealType r0;
  RealType cb1;
  RealType ca1;
  RealType beta;
  RealType D_e;
  RealType r_e;
  NonBondedInteractionType *interactionType;
  NonBondedInteractionTypeEnum nbit;
  string itype;
  string at2;
  string at1;
  int nTokens;
  StringTokenizer tokenizer;
  value_type *in_stack_fffffffffffffa38;
  errorStruct *peVar6;
  EAMInteractionType *in_stack_fffffffffffffa40;
  RealType in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  BuckinghamType in_stack_fffffffffffffa54;
  string *in_stack_fffffffffffffa58;
  NonBondedInteractionsSectionParser *in_stack_fffffffffffffa60;
  RealType in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  errorStruct *in_stack_fffffffffffffa78;
  EAMInteractionType *in_stack_fffffffffffffa80;
  string *in_stack_fffffffffffffa88;
  ForceField *in_stack_fffffffffffffa90;
  StringTokenizer *in_stack_fffffffffffffae8;
  int local_294;
  locale local_1e0 [8];
  string local_1d8 [32];
  int local_1b8;
  int local_1b4;
  double local_1b0;
  double local_1a8;
  int local_19c;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  RealType local_148;
  RealType local_140;
  double local_138;
  double local_130;
  double local_128;
  EAMInteractionType *local_120;
  NonBondedInteractionTypeEnum local_114;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  int local_b0;
  allocator<char> local_99;
  string local_98 [124];
  uint local_1c;
  
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa80,in_stack_fffffffffffffa78->errMsg,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_fffffffffffffa80,(string *)in_stack_fffffffffffffa78,
             (string *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  local_b0 = StringTokenizer::countTokens
                       ((StringTokenizer *)
                        CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  if (local_b0 < 3) {
    snprintf(painCave.errMsg,2000,
             "NonBondedInteractionsSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    painCave.isFatal = 1;
    simError();
  }
  RVar4 = ForceFieldOptions::getMetallicEnergyUnitScaling((ForceFieldOptions *)0x2db68b);
  *(RealType *)(in_RDI + 0x60) = RVar4;
  RVar4 = ForceFieldOptions::getEnergyUnitScaling((ForceFieldOptions *)0x2db6b5);
  *(RealType *)(in_RDI + 0x68) = RVar4;
  RVar4 = ForceFieldOptions::getDistanceUnitScaling((ForceFieldOptions *)0x2db6df);
  *(RealType *)(in_RDI + 0x70) = RVar4;
  StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffae8);
  StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffae8);
  StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffae8);
  local_114 = getNonBondedInteractionTypeEnum(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  local_b0 = local_b0 + -3;
  local_120 = (EAMInteractionType *)0x0;
  switch(local_114) {
  case ShiftedMorse:
    if (local_b0 == 3) {
      dVar1 = *(double *)(in_RDI + 0x70);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_150 = dVar1 * RVar4;
      dVar1 = *(double *)(in_RDI + 0x68);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_158 = dVar1 * RVar4;
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_160 = RVar4 / *(double *)(in_RDI + 0x70);
      pEVar3 = (EAMInteractionType *)operator_new(0x80);
      MorseInteractionType::MorseInteractionType
                ((MorseInteractionType *)
                 CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                 in_stack_fffffffffffffa68,(RealType)in_stack_fffffffffffffa60,
                 (RealType)in_stack_fffffffffffffa58,in_stack_fffffffffffffa54);
      local_120 = pEVar3;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 6 tokens expected.  \n"
               ,(ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    break;
  case LennardJones:
    if (local_b0 == 2) {
      dVar1 = *(double *)(in_RDI + 0x70);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_180 = dVar1 * RVar4;
      dVar1 = *(double *)(in_RDI + 0x68);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_188 = dVar1 * RVar4;
      pEVar3 = (EAMInteractionType *)operator_new(0x70);
      LennardJonesInteractionType::LennardJonesInteractionType
                ((LennardJonesInteractionType *)in_stack_fffffffffffffa60,
                 (RealType)in_stack_fffffffffffffa58,
                 (RealType)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
      local_120 = pEVar3;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 5 tokens expected.  \n"
               ,(ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    break;
  case RepulsiveMorse:
    if (local_b0 == 3) {
      dVar1 = *(double *)(in_RDI + 0x70);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_168 = dVar1 * RVar4;
      dVar1 = *(double *)(in_RDI + 0x68);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_170 = dVar1 * RVar4;
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_178 = RVar4 / *(double *)(in_RDI + 0x70);
      pEVar3 = (EAMInteractionType *)operator_new(0x80);
      MorseInteractionType::MorseInteractionType
                ((MorseInteractionType *)
                 CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                 in_stack_fffffffffffffa68,(RealType)in_stack_fffffffffffffa60,
                 (RealType)in_stack_fffffffffffffa58,in_stack_fffffffffffffa54);
      local_120 = pEVar3;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 6 tokens expected.  \n"
               ,(ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    break;
  case RepulsivePower:
    if (local_b0 < 3) {
      snprintf(painCave.errMsg,2000,
               "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 6 tokens expected.  \n"
               ,(ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    else {
      dVar1 = *(double *)(in_RDI + 0x70);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      iVar2 = (int)((ulong)in_stack_fffffffffffffa48 >> 0x20);
      local_190 = dVar1 * RVar4;
      dVar1 = *(double *)(in_RDI + 0x68);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_198 = dVar1 * RVar4;
      local_19c = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffffa60);
      pEVar3 = (EAMInteractionType *)operator_new(0x78);
      RepulsivePowerInteractionType::RepulsivePowerInteractionType
                ((RepulsivePowerInteractionType *)in_stack_fffffffffffffa60,
                 (RealType)in_stack_fffffffffffffa58,
                 (RealType)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),iVar2);
      local_120 = pEVar3;
    }
    break;
  case Mie:
    if (local_b0 == 4) {
      dVar1 = *(double *)(in_RDI + 0x70);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_1a8 = dVar1 * RVar4;
      dVar1 = *(double *)(in_RDI + 0x68);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_1b0 = dVar1 * RVar4;
      local_1b4 = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffffa60);
      local_1b8 = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffffa60);
      pEVar3 = (EAMInteractionType *)operator_new(0x78);
      MieInteractionType::MieInteractionType
                ((MieInteractionType *)in_stack_fffffffffffffa60,(RealType)in_stack_fffffffffffffa58
                 ,(RealType)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 (int)((ulong)in_stack_fffffffffffffa48 >> 0x20),SUB84(in_stack_fffffffffffffa48,0))
      ;
      local_120 = pEVar3;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 7 tokens expected.  \n"
               ,(ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    break;
  case MAW:
    if (local_b0 == 5) {
      dVar1 = *(double *)(in_RDI + 0x70);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_128 = dVar1 * RVar4;
      dVar1 = *(double *)(in_RDI + 0x68);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_130 = dVar1 * RVar4;
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_138 = RVar4 / *(double *)(in_RDI + 0x70);
      local_140 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      local_148 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      pEVar3 = (EAMInteractionType *)operator_new(0x88);
      MAWInteractionType::MAWInteractionType
                ((MAWInteractionType *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70)
                 ,in_stack_fffffffffffffa68,(RealType)in_stack_fffffffffffffa60,
                 (RealType)in_stack_fffffffffffffa58,
                 (RealType)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48);
      local_120 = pEVar3;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 8 tokens expected.  \n"
               ,(ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    break;
  case Buckingham:
    if (local_b0 < 4) {
      snprintf(painCave.errMsg,2000,
               "NonBondedInteractionsSectionParser Error: Not enough tokens at line %d\n",
               (ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    else {
      StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffae8);
      std::locale::locale(local_1e0);
      toUpper<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60,(locale *)in_stack_fffffffffffffa58);
      std::locale::~locale(local_1e0);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      iVar2 = std::__cxx11::string::compare((char *)local_1d8);
      if (iVar2 == 0) {
        iVar2 = std::__cxx11::string::compare((char *)local_1d8);
        if (iVar2 == 0) {
          snprintf(painCave.errMsg,2000,
                   "NonBondedInteractionsSectionParser Error: Unknown Buckingham Type at line %d\n",
                   (ulong)local_1c);
          painCave.isFatal = 1;
          simError();
        }
        else {
          pEVar3 = (EAMInteractionType *)operator_new(0x90);
          BuckinghamInteractionType::BuckinghamInteractionType
                    ((BuckinghamInteractionType *)
                     CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                     in_stack_fffffffffffffa68,(RealType)in_stack_fffffffffffffa60,
                     (RealType)in_stack_fffffffffffffa58,in_stack_fffffffffffffa54);
          local_120 = pEVar3;
        }
      }
      else {
        StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
        StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
        pEVar3 = (EAMInteractionType *)operator_new(0x90);
        BuckinghamInteractionType::BuckinghamInteractionType
                  ((BuckinghamInteractionType *)in_stack_fffffffffffffa80,
                   (RealType)in_stack_fffffffffffffa78,
                   (RealType)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                   in_stack_fffffffffffffa68,(RealType)in_stack_fffffffffffffa60,
                   (RealType)in_stack_fffffffffffffa58,in_stack_fffffffffffffa54);
        local_120 = pEVar3;
      }
      std::__cxx11::string::~string(local_1d8);
    }
    break;
  case EAMZhou:
    if (local_b0 == 7) {
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      pEVar3 = (EAMInteractionType *)operator_new(0xe0);
      EAMInteractionType::EAMInteractionType
                ((EAMInteractionType *)in_stack_fffffffffffffa90,(RealType)in_stack_fffffffffffffa88
                 ,(RealType)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
                 (RealType)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                 in_stack_fffffffffffffa68,(RealType)in_stack_fffffffffffffa60,
                 (RealType)in_stack_fffffffffffffa58);
      local_120 = pEVar3;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 10 tokens expected.  \n"
               ,(ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    break;
  case EAMOxides:
    if (local_b0 == 5) {
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      in_stack_fffffffffffffa90 =
           (ForceField *)
           StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      in_stack_fffffffffffffa88 =
           (string *)
           StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
      in_stack_fffffffffffffa80 = (EAMInteractionType *)operator_new(0xe0);
      EAMInteractionType::EAMInteractionType
                (in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
                 (RealType)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                 in_stack_fffffffffffffa68,(RealType)in_stack_fffffffffffffa60,
                 (RealType)in_stack_fffffffffffffa58);
      local_120 = in_stack_fffffffffffffa80;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 8 tokens expected.  \n"
               ,(ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    break;
  case InversePowerSeries:
    if ((local_b0 < 2) || (local_b0 % 2 != 0)) {
      in_stack_fffffffffffffa78 = &painCave;
      snprintf(painCave.errMsg,2000,
               "NonBondedInteractionsSectionParser Error: Not enough tokens at line %d\n",
               (ulong)local_1c);
      in_stack_fffffffffffffa78->isFatal = 1;
      simError();
    }
    else {
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 0x2dcac0);
      iVar2 = local_b0 / 2;
      for (local_294 = 0; local_294 < iVar2; local_294 = local_294 + 1) {
        StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffffa60);
        StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffa80);
        in_stack_fffffffffffffa60 =
             (NonBondedInteractionsSectionParser *)
             std::pow<double,int>
                       ((double)in_stack_fffffffffffffa40,
                        (int)((ulong)in_stack_fffffffffffffa38 >> 0x20));
        pVar5 = std::make_pair<int&,double&>
                          ((int *)in_stack_fffffffffffffa40,(double *)in_stack_fffffffffffffa38);
        in_stack_fffffffffffffa54 = pVar5.first;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
      }
      in_stack_fffffffffffffa40 = (EAMInteractionType *)operator_new(0x90);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 in_stack_fffffffffffffa90,
                 (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 in_stack_fffffffffffffa88);
      InversePowerSeriesInteractionType::InversePowerSeriesInteractionType
                ((InversePowerSeriesInteractionType *)in_stack_fffffffffffffa90,
                 (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 in_stack_fffffffffffffa88);
      local_120 = in_stack_fffffffffffffa40;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    }
    break;
  case Unknown:
  default:
    peVar6 = &painCave;
    snprintf(painCave.errMsg,2000,
             "NonBondedInteractionsSectionParser Error: Unknown Interaction Type at line %d\n",
             (ulong)local_1c);
    peVar6->isFatal = 1;
    simError();
  }
  if (local_120 != (EAMInteractionType *)0x0) {
    ForceField::addNonBondedInteractionType
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
               (string *)in_stack_fffffffffffffa80,
               (NonBondedInteractionType *)in_stack_fffffffffffffa78);
  }
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_d0);
  StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_fffffffffffffa40);
  return;
}

Assistant:

void NonBondedInteractionsSectionParser::parseLine(ForceField& ff,
                                                     const std::string& line,
                                                     int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();
    if (nTokens < 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NonBondedInteractionsSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }

    meus_ = options_.getMetallicEnergyUnitScaling();
    eus_  = options_.getEnergyUnitScaling();
    dus_  = options_.getDistanceUnitScaling();

    std::string at1   = tokenizer.nextToken();
    std::string at2   = tokenizer.nextToken();
    std::string itype = tokenizer.nextToken();

    NonBondedInteractionTypeEnum nbit = getNonBondedInteractionTypeEnum(itype);
    nTokens -= 3;
    NonBondedInteractionType* interactionType = NULL;

    // switch is a nightmare to maintain
    switch (nbit) {
    case MAW:
      if (nTokens != 5) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 8 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType r_e    = dus_ * tokenizer.nextTokenAsDouble();
        RealType D_e    = eus_ * tokenizer.nextTokenAsDouble();
        RealType beta   = tokenizer.nextTokenAsDouble() / dus_;
        RealType ca1    = tokenizer.nextTokenAsDouble();
        RealType cb1    = tokenizer.nextTokenAsDouble();
        interactionType = new MAWInteractionType(D_e, beta, r_e, ca1, cb1);
      }
      break;

    case ShiftedMorse:
      if (nTokens != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 6 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType r0     = dus_ * tokenizer.nextTokenAsDouble();
        RealType D0     = eus_ * tokenizer.nextTokenAsDouble();
        RealType beta0  = tokenizer.nextTokenAsDouble() / dus_;
        interactionType = new MorseInteractionType(D0, beta0, r0, mtShifted);
      }
      break;

    case RepulsiveMorse:
      if (nTokens != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 6 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType r0     = dus_ * tokenizer.nextTokenAsDouble();
        RealType D0     = eus_ * tokenizer.nextTokenAsDouble();
        RealType beta0  = tokenizer.nextTokenAsDouble() / dus_;
        interactionType = new MorseInteractionType(D0, beta0, r0, mtRepulsive);
      }
      break;

    case LennardJones:
      if (nTokens != 2) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 5 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType sigma   = dus_ * tokenizer.nextTokenAsDouble();
        RealType epsilon = eus_ * tokenizer.nextTokenAsDouble();
        interactionType  = new LennardJonesInteractionType(sigma, epsilon);
      }
      break;

    case RepulsivePower:
      if (nTokens < 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 6 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType sigma   = dus_ * tokenizer.nextTokenAsDouble();
        RealType epsilon = eus_ * tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        interactionType =
            new RepulsivePowerInteractionType(sigma, epsilon, nRep);
      }
      break;

    case Mie:
      if (nTokens != 4) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 7 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType sigma   = dus_ * tokenizer.nextTokenAsDouble();
        RealType epsilon = eus_ * tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        int mAtt         = tokenizer.nextTokenAsInt();
        interactionType  = new MieInteractionType(sigma, epsilon, nRep, mAtt);
      }
      break;

    case Buckingham:
      if (nTokens < 4) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Not enough tokens "
                 "at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        std::string btype = tokenizer.nextToken();
        toUpper(btype);

        RealType A = eus_ * tokenizer.nextTokenAsDouble();
        RealType B = tokenizer.nextTokenAsDouble() / dus_;
        RealType C =
            tokenizer.nextTokenAsDouble();  // should also have a scaling
        RealType sigma   = 0.0;
        RealType epsilon = 0.0;

        if (btype.compare("MODIFIED")) {
          sigma           = dus_ * tokenizer.nextTokenAsDouble();
          epsilon         = eus_ * tokenizer.nextTokenAsDouble();
          interactionType = new BuckinghamInteractionType(A, B, C, sigma,
                                                          epsilon, btModified);

        } else if (btype.compare("TRADITIONAL")) {
          interactionType =
              new BuckinghamInteractionType(A, B, C, btTraditional);
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "NonBondedInteractionsSectionParser Error: Unknown "
                   "Buckingham Type at "
                   "line %d\n",
                   lineNo);
          painCave.isFatal = 1;
          simError();
        }
      }
      break;

    case EAMZhou:
      if (nTokens != 7) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 10 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType re    = dus_ * tokenizer.nextTokenAsDouble();
        RealType alpha = tokenizer.nextTokenAsDouble();
        RealType beta  = tokenizer.nextTokenAsDouble();
        // Because EAM is a metallic potential, we'll use the metallic
        // unit scaling for these two parameters
        RealType A      = meus_ * tokenizer.nextTokenAsDouble();
        RealType B      = meus_ * tokenizer.nextTokenAsDouble();
        RealType kappa  = tokenizer.nextTokenAsDouble();
        RealType lambda = tokenizer.nextTokenAsDouble();

        interactionType =
            new EAMInteractionType(re, alpha, beta, A, B, kappa, lambda);
      }
      break;

    case EAMOxides:
      if (nTokens != 5) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 8 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType re    = dus_ * tokenizer.nextTokenAsDouble();
        RealType alpha = tokenizer.nextTokenAsDouble();
        // Because EAM is a metallic potential, we'll use the metallic
        // unit scaling for these two parameters
        RealType A  = meus_ * tokenizer.nextTokenAsDouble();
        RealType Ci = tokenizer.nextTokenAsDouble();
        RealType Cj = tokenizer.nextTokenAsDouble();

        interactionType = new EAMInteractionType(re, alpha, A, Ci, Cj);
      }
      break;

    case InversePowerSeries:
      if (nTokens < 2 || nTokens % 2 != 0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Not enough tokens "
                 "at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        std::vector<std::pair<int, RealType>> series;
        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble() * eus_ * pow(dus_, power);
          series.push_back(std::make_pair(power, coefficient));
        }
        interactionType = new InversePowerSeriesInteractionType(series);
      }
      break;

    case Unknown:
    default:
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NonBondedInteractionsSectionParser Error: Unknown Interaction "
               "Type at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();

      break;
    }

    if (interactionType != NULL) {
      ff.addNonBondedInteractionType(at1, at2, interactionType);
    }
  }